

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicSyntaxSSO::Run(BasicSyntaxSSO *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  vec3 *in_R9;
  ulong uVar8;
  int *piVar9;
  float data [12];
  allocator<char> local_99;
  long *local_98;
  long *local_90;
  long local_88 [2];
  char *local_78;
  long *local_70;
  long *local_68;
  undefined8 uStack_60;
  long local_58 [5];
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  lVar6 = 0x10;
  if (bVar1) {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
               ,"");
    local_98 = (long *)0x1a7411d;
    local_90 = local_68;
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,2,(GLchar **)&local_98);
    this->m_fsp = GVar3;
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_fsp);
    lVar6 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_pipeline);
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,2,this->m_fsp);
      local_58[2] = 0x40400000bf800000;
      local_58[3] = 0x3f80000000000000;
      local_58[0] = -0x407fffffbfc00000;
      local_58[1] = 0x3f80000000000000;
      local_68 = (long *)0xbf800000bf800000;
      uStack_60 = 0x3f80000000000000;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
      uVar8 = 0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
      uVar7 = 0x88e4;
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x30,&local_68,0x88e4);
      glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      bVar1 = true;
      piVar9 = &DAT_01a92584;
      do {
        iVar4 = *piVar9;
        if (this->m_vsp != 0) {
          glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,(char *)((long)&DAT_01a92584 + (long)iVar4),&local_99);
        local_78 = "#version 430 core\n";
        local_70 = local_98;
        GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,2,&local_78);
        this->m_vsp = GVar3;
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                          (&this->super_ShaderStorageBufferObjectBase,this->m_vsp);
        if (!bVar2) break;
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,1,this->m_vsp);
        glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
        iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
        iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        local_98 = (long *)0x3f80000000000000;
        local_90 = (long *)((ulong)local_90 & 0xffffffff00000000);
        bVar2 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                          (&this->super_ShaderStorageBufferObjectBase,iVar4,
                           *(int *)(CONCAT44(extraout_var_00,iVar5) + 4),(int)&local_98,(int)uVar7,
                           in_R9);
        if (!bVar2) break;
        bVar1 = uVar8 < 7;
        uVar8 = uVar8 + 1;
        piVar9 = piVar9 + 1;
      } while (uVar8 != 8);
      lVar6 = -(ulong)bVar1;
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		const int		  kCount		  = 8;
		const char* const glsl_vs[kCount] = {
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "layout(std430) buffer Buffer {" NL
			   "  vec4 position[3];" NL "} g_input_buffer;" NL "void main() {" NL
			   "  gl_Position = g_input_buffer.position[gl_VertexID];" NL "}",
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "coherent buffer Buffer {" NL
			   "  vec4 position0;" NL "  coherent vec4 position1;" NL "  restrict readonly vec4 position2;" NL
			   "} g_input_buffer;" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_input_buffer.position0;" NL
			   "  if (gl_VertexID == 1) gl_Position = g_input_buffer.position1;" NL
			   "  if (gl_VertexID == 2) gl_Position = g_input_buffer.position2;" NL "}",
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL
			   "layout(std140, binding = 0) readonly buffer Buffer {" NL "  readonly vec4 position[];" NL "};" NL
			   "void main() {" NL "  gl_Position = position[gl_VertexID];" NL "}",
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL
			   "layout(std430, column_major, std140, std430, row_major, packed, shared) buffer;" NL
			   "layout(std430) buffer;" NL "coherent restrict volatile buffer Buffer {" NL
			   "  restrict coherent vec4 position[];" NL "} g_buffer;" NL "void main() {" NL
			   "  gl_Position = g_buffer.position[gl_VertexID];" NL "}",
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "buffer Buffer {" NL "  vec4 position[3];" NL
			   "} g_buffer[1];" NL "void main() {" NL "  gl_Position = g_buffer[0].position[gl_VertexID];" NL "}",
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "layout(shared) coherent buffer Buffer {" NL
			   "  restrict volatile vec4 position0;" NL "  readonly vec4 position1;" NL "  vec4 position2;" NL
			   "} g_buffer[1];" NL "void main() {" NL "  if (gl_VertexID == 0) gl_Position = g_buffer[0].position0;" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer[0].position1;" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer[0].position2;" NL "}",
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "layout(packed) coherent buffer Buffer {" NL
			   "  vec4 position01[];" NL "  vec4 position2;" NL "} g_buffer;" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_buffer.position01[0];" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer.position01[1];" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer.position2;" NL "}",
			NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "layout(std430) coherent buffer Buffer {" NL
			   "  coherent vec4 position01[];" NL "  vec4 position2[];" NL "} g_buffer;" NL "void main() {" NL
			   "  switch (gl_VertexID) {" NL "    case 0: gl_Position = g_buffer.position01[0]; break;" NL
			   "    case 1: gl_Position = g_buffer.position01[1]; break;" NL
			   "    case 2: gl_Position = g_buffer.position2[gl_VertexID - 2]; break;" NL "  }" NL "}",
		};
		const char* const glsl_fs = NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
									   "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);
		if (!CheckProgram(m_fsp))
			return ERROR;

		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		// full viewport triangle
		const float data[12] = { -1.0f, -1.0f, 0.0f, 1.0f, 3.0f, -1.0f, 0.0f, 1.0f, -1.0f, 3.0f, 0.0f, 1.0f };
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		glBindProgramPipeline(m_pipeline);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);

		for (int i = 0; i < kCount; ++i)
		{
			if (!RunIteration(glsl_vs[i]))
				return ERROR;
		}

		return NO_ERROR;
	}